

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void start_pass_2_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  int in_ESI;
  long *in_RDI;
  size_t arraysize;
  int i;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  int local_24;
  j_decompress_ptr cinfo_00;
  
  lVar2 = in_RDI[0x4e];
  cinfo_00 = *(j_decompress_ptr *)(lVar2 + 0x30);
  if ((int)in_RDI[0xe] != 0) {
    *(undefined4 *)(in_RDI + 0xe) = 2;
  }
  if (in_ESI == 0) {
    if ((int)in_RDI[0xe] == 2) {
      *(code **)(lVar2 + 8) = pass2_fs_dither;
    }
    else {
      *(code **)(lVar2 + 8) = pass2_no_dither;
    }
    *(code **)(lVar2 + 0x10) = finish_pass2;
    iVar1 = *(int *)((long)in_RDI + 0x9c);
    if (iVar1 < 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x38;
      *(undefined4 *)(*in_RDI + 0x2c) = 1;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (0x100 < iVar1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x39;
      *(undefined4 *)(*in_RDI + 0x2c) = 0x100;
      (**(code **)*in_RDI)(in_RDI);
    }
    if ((int)in_RDI[0xe] == 2) {
      in_stack_ffffffffffffffd0 = (void *)((ulong)((int)in_RDI[0x11] + 2) * 6);
      if (*(long *)(lVar2 + 0x40) == 0) {
        uVar3 = (**(code **)(in_RDI[1] + 8))(in_RDI,1,in_stack_ffffffffffffffd0);
        *(undefined8 *)(lVar2 + 0x40) = uVar3;
      }
      jzero_far(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (*(long *)(lVar2 + 0x50) == 0) {
        init_error_limit(cinfo_00);
      }
      *(undefined4 *)(lVar2 + 0x48) = 0;
    }
  }
  else {
    *(code **)(lVar2 + 8) = prescan_quantize;
    *(code **)(lVar2 + 0x10) = finish_pass1;
    *(undefined4 *)(lVar2 + 0x38) = 1;
  }
  if (*(int *)(lVar2 + 0x38) != 0) {
    for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
      jzero_far(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    *(undefined4 *)(lVar2 + 0x38) = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_2_quant(j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int i;

  /* Only F-S dithering or no dithering is supported. */
  /* If user asks for ordered dither, give them F-S. */
  if (cinfo->dither_mode != JDITHER_NONE)
    cinfo->dither_mode = JDITHER_FS;

  if (is_pre_scan) {
    /* Set up method pointers */
    cquantize->pub.color_quantize = prescan_quantize;
    cquantize->pub.finish_pass = finish_pass1;
    cquantize->needs_zeroed = TRUE; /* Always zero histogram */
  } else {
    /* Set up method pointers */
    if (cinfo->dither_mode == JDITHER_FS)
      cquantize->pub.color_quantize = pass2_fs_dither;
    else
      cquantize->pub.color_quantize = pass2_no_dither;
    cquantize->pub.finish_pass = finish_pass2;

    /* Make sure color count is acceptable */
    i = cinfo->actual_number_of_colors;
    if (i < 1)
      ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, 1);
    if (i > MAXNUMCOLORS)
      ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXNUMCOLORS);

    if (cinfo->dither_mode == JDITHER_FS) {
      size_t arraysize =
        (size_t)((cinfo->output_width + 2) * (3 * sizeof(FSERROR)));
      /* Allocate Floyd-Steinberg workspace if we didn't already. */
      if (cquantize->fserrors == NULL)
        cquantize->fserrors = (FSERRPTR)(*cinfo->mem->alloc_large)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, arraysize);
      /* Initialize the propagated errors to zero. */
      jzero_far((void *)cquantize->fserrors, arraysize);
      /* Make the error-limit table if we didn't already. */
      if (cquantize->error_limiter == NULL)
        init_error_limit(cinfo);
      cquantize->on_odd_row = FALSE;
    }

  }
  /* Zero the histogram or inverse color map, if necessary */
  if (cquantize->needs_zeroed) {
    for (i = 0; i < HIST_C0_ELEMS; i++) {
      jzero_far((void *)histogram[i],
                HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof(histcell));
    }
    cquantize->needs_zeroed = FALSE;
  }
}